

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int net_socket_read_wait(NETSOCKET sock,int time)

{
  long lVar1;
  ulong uVar2;
  uint __i;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long __d_1;
  long __d;
  ulong uVar8;
  long in_FS_OFFSET;
  timeval tv;
  fd_set readfds;
  
  uVar6 = sock.ipv6sock;
  uVar7 = sock._0_8_;
  uVar2 = (ulong)uVar6;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = uVar7 >> 0x20;
  tv.tv_sec = 0;
  tv.tv_usec = (__suseconds_t)(time * 1000);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    readfds.__fds_bits[lVar3] = 0;
  }
  if ((long)uVar7 < 0) {
    uVar4 = 0;
  }
  else {
    lVar3 = __fdelt_chk(uVar8);
    readfds.__fds_bits[lVar3] = readfds.__fds_bits[lVar3] | 1L << ((byte)sock.ipv4sock & 0x3f);
    uVar4 = sock.ipv4sock;
  }
  if (-1 < (int)uVar6) {
    lVar3 = __fdelt_chk(uVar2);
    readfds.__fds_bits[lVar3] = readfds.__fds_bits[lVar3] | 1L << ((byte)sock.ipv6sock & 0x3f);
    if ((int)uVar4 <= (int)uVar6) {
      uVar4 = uVar6;
    }
  }
  select(uVar4 + 1,(fd_set *)&readfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
  iVar5 = 1;
  if (-1 < (long)uVar7) {
    lVar3 = __fdelt_chk(uVar8);
    if (((ulong)readfds.__fds_bits[lVar3] >> (uVar8 & 0x3f) & 1) != 0) goto LAB_001c12e0;
  }
  if (-1 < (int)uVar6) {
    lVar3 = __fdelt_chk(uVar2);
    if (((ulong)readfds.__fds_bits[lVar3] >> (uVar2 & 0x3f) & 1) != 0) goto LAB_001c12e0;
  }
  iVar5 = 0;
LAB_001c12e0:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int net_socket_read_wait(NETSOCKET sock, int time)
{
	struct timeval tv;
	fd_set readfds;
	int sockid;

	tv.tv_sec = 0;
	tv.tv_usec = 1000*time;
	sockid = 0;

	FD_ZERO(&readfds);
	if(sock.ipv4sock >= 0)
	{
		FD_SET(sock.ipv4sock, &readfds);
		sockid = sock.ipv4sock;
	}
	if(sock.ipv6sock >= 0)
	{
		FD_SET(sock.ipv6sock, &readfds);
		if(sock.ipv6sock > sockid)
			sockid = sock.ipv6sock;
	}

	/* don't care about writefds and exceptfds */
	select(sockid+1, &readfds, NULL, NULL, &tv);

	if(sock.ipv4sock >= 0 && FD_ISSET(sock.ipv4sock, &readfds))
		return 1;

	if(sock.ipv6sock >= 0 && FD_ISSET(sock.ipv6sock, &readfds))
		return 1;

	return 0;
}